

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

SquareMatrix<double> * __thiscall
qclab::dense::SquareMatrix<double>::operator*=(SquareMatrix<double> *this,SquareMatrix<double> *rhs)

{
  long lVar1;
  long lVar2;
  double *pdVar3;
  __uniq_ptr_impl<double,_std::default_delete<double[]>_> __p;
  tuple<double_*,_std::default_delete<double[]>_> in_RAX;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int64_t i;
  long lVar9;
  double *pdVar10;
  pointer pdVar11;
  unique_ptr<double[],_std::default_delete<double[]>_> new_data;
  __uniq_ptr_impl<double,_std::default_delete<double[]>_> local_38;
  
  lVar1 = this->size_;
  if (lVar1 == rhs->size_) {
    local_38._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         (tuple<double_*,_std::default_delete<double[]>_>)
         (tuple<double_*,_std::default_delete<double[]>_>)
         in_RAX.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    init_unique_array<double>((dense *)&local_38,lVar1 * lVar1);
    __p._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         local_38._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
         super__Head_base<0UL,_double_*,_false>._M_head_impl;
    lVar1 = this->size_;
    lVar4 = 0;
    lVar5 = 0;
    if (0 < lVar1) {
      lVar5 = lVar1;
    }
    for (lVar7 = 0; lVar7 != lVar5; lVar7 = lVar7 + 1) {
      lVar8 = 0;
      for (lVar9 = 0; lVar9 != lVar1; lVar9 = lVar9 + 1) {
        pdVar11 = (pointer)(lVar9 * 8 +
                           (long)local_38._M_t.
                                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                                 super__Head_base<0UL,_double_*,_false>._M_head_impl);
        lVar2 = rhs->size_;
        pdVar3 = (rhs->data_)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                 _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl;
        pdVar10 = (double *)
                  ((long)(this->data_)._M_t.
                         super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                         super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                         super__Head_base<0UL,_double_*,_false>._M_head_impl + lVar8);
        for (lVar6 = 0; lVar1 != lVar6; lVar6 = lVar6 + 1) {
          pdVar11[lVar1 * lVar7] =
               *pdVar10 * *(double *)((long)pdVar3 + lVar6 * 8 + lVar2 * lVar4) +
               pdVar11[lVar1 * lVar7];
          pdVar10 = pdVar10 + lVar1;
        }
        lVar8 = lVar8 + 8;
      }
      lVar4 = lVar4 + 8;
    }
    local_38._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
    super__Head_base<0UL,_double_*,_false>._M_head_impl =
         (tuple<double_*,_std::default_delete<double[]>_>)
         (_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)0x0;
    std::__uniq_ptr_impl<double,_std::default_delete<double[]>_>::reset
              ((__uniq_ptr_impl<double,_std::default_delete<double[]>_> *)&this->data_,
               (pointer)__p._M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                        super__Head_base<0UL,_double_*,_false>._M_head_impl);
    std::unique_ptr<double[],_std::default_delete<double[]>_>::~unique_ptr
              ((unique_ptr<double[],_std::default_delete<double[]>_> *)&local_38);
    return this;
  }
  __assert_fail("size_ == rhs.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                ,0xb0,
                "SquareMatrix<T> &qclab::dense::SquareMatrix<double>::operator*=(const SquareMatrix<T> &) [T = double]"
               );
}

Assistant:

inline SquareMatrix< T >& operator*=( const SquareMatrix< T >& rhs ) {
          assert( size_ == rhs.size() ) ;
          auto new_data = init_unique_array< T >( size_ * size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              for ( int64_t k = 0; k < size_; k++ ) {
                new_data.get()[ i + j*size_ ] += (*this)(i,k) * rhs(k,j) ;
              }
            }
          }
          data_ = std::move( new_data ) ;
          return *this ;
        }